

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cscript.c
# Opt level: O2

int envy_bios_parse_bit_2(envy_bios *bios,envy_bios_bit_entry *bit)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  
  (bios->i2cscript).bit = bit;
  uVar1 = bit->t_len;
  if (uVar1 < 4) {
    fprintf(_stderr,"I2C script table too short: %d < %d\n",(ulong)uVar1,4);
    iVar2 = -0x16;
  }
  else {
    if (uVar1 != 4) {
      fprintf(_stderr,"I2C script table longer than expected: %d > %d\n",(ulong)uVar1,4);
    }
    iVar2 = bios_u16(bios,(uint)bit->t_offset,&(bios->i2cscript).unk00);
    iVar3 = bios_u16(bios,bit->t_offset + 2,&(bios->i2cscript).script);
    if (iVar3 == 0 && iVar2 == 0) {
      (bios->i2cscript).valid = '\x01';
      iVar2 = 0;
    }
    else {
      iVar2 = -0xe;
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_bit_2 (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_i2cscript *i2cscript = &bios->i2cscript;
	i2cscript->bit = bit;
	int wantlen = 4;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("I2C script table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("I2C script table longer than expected: %d > %d\n", bit->t_len, wantlen);
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &i2cscript->unk00);
	err |= bios_u16(bios, bit->t_offset+2, &i2cscript->script);
	if (err)
		return -EFAULT;
	i2cscript->valid = 1;
	return 0;
}